

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

bool __thiscall
OSSLEDDSA::reconstructPrivateKey
          (OSSLEDDSA *this,PrivateKey **ppPrivateKey,ByteString *serialisedData)

{
  uint uVar1;
  size_t sVar2;
  OSSLEDPrivateKey *this_00;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  OSSLEDPrivateKey *priv;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar2 = ByteString::size((ByteString *)0x12eb55), sVar2 != 0)) {
    this_00 = (OSSLEDPrivateKey *)operator_new(0x68);
    OSSLEDPrivateKey::OSSLEDPrivateKey(this_00);
    uVar1 = (*(this_00->super_EDPrivateKey).super_PrivateKey.super_Serialisable._vptr_Serialisable
              [0xd])(this_00,in_RDX);
    if ((uVar1 & 1) == 0) {
      if (this_00 != (OSSLEDPrivateKey *)0x0) {
        (*(this_00->super_EDPrivateKey).super_PrivateKey.super_Serialisable._vptr_Serialisable[2])()
        ;
      }
      return false;
    }
    *in_RSI = this_00;
    return true;
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructPrivateKey(PrivateKey** ppPrivateKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPrivateKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLEDPrivateKey* priv = new OSSLEDPrivateKey();

	if (!priv->deserialise(serialisedData))
	{
		delete priv;

		return false;
	}

	*ppPrivateKey = priv;

	return true;
}